

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O1

assetsys_t * assetsys_create(void *memctx)

{
  assetsys_t *paVar1;
  assetsys_internal_mount_t *paVar2;
  assetsys_internal_collated_t *paVar3;
  strpool_config_t config;
  strpool_config_t local_38;
  
  paVar1 = (assetsys_t *)malloc(0x1b0);
  paVar1->memctx = memctx;
  local_38.ignore_case = 0;
  local_38.counter_bits = 0x20;
  local_38.index_bits = 0x20;
  local_38.entry_capacity = 0x1000;
  local_38.block_capacity = 0x20;
  local_38.block_size = 0x40000;
  local_38.min_length = 0x17;
  local_38._36_4_ = 0;
  local_38.memctx = memctx;
  strpool_init(&paVar1->strpool,&local_38);
  paVar1->mounts_count = 0;
  paVar1->mounts_capacity = 0x10;
  paVar2 = (assetsys_internal_mount_t *)malloc(0x980);
  paVar1->mounts = paVar2;
  paVar1->collated_count = 0;
  paVar1->collated_capacity = 0x4000;
  paVar3 = (assetsys_internal_collated_t *)malloc(0x60000);
  paVar1->collated = paVar3;
  return paVar1;
}

Assistant:

assetsys_t* assetsys_create( void* memctx )
    {
    assetsys_t* sys = (assetsys_t*) ASSETSYS_MALLOC( memctx, sizeof( assetsys_t ) );
    sys->memctx = memctx;

    strpool_config_t config = strpool_default_config;
    config.memctx = memctx;
    strpool_init( &sys->strpool, &config );

    sys->mounts_count = 0;
    sys->mounts_capacity = 16;
    sys->mounts = (struct assetsys_internal_mount_t*) ASSETSYS_MALLOC( memctx, 
        sizeof( *sys->mounts ) * sys->mounts_capacity );

    sys->collated_count = 0;
    sys->collated_capacity = 16384;
    sys->collated = (struct assetsys_internal_collated_t*) ASSETSYS_MALLOC( memctx, 
        sizeof( *sys->collated ) * sys->collated_capacity );
    return sys;
    }